

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

Real M_GetVal(Matrix *M,size_t RoC,size_t Entry)

{
  LASErrIdType LVar1;
  Real local_28;
  Real Val;
  size_t Entry_local;
  size_t RoC_local;
  Matrix *M_local;
  
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    if ((((M->ElOrder == Rowws) && (RoC != 0)) && (RoC <= M->RowDim)) ||
       (((M->ElOrder == Clmws && (RoC != 0)) && ((RoC <= M->ClmDim && (Entry < M->Len[RoC])))))) {
      local_28 = M->El[RoC][Entry].Val;
    }
    else {
      LASError(LASRangeErr,"M_GetVal",M->Name,(char *)0x0,(char *)0x0);
      local_28 = 0.0;
    }
  }
  else {
    local_28 = 0.0;
  }
  return local_28;
}

Assistant:

Real M_GetVal(Matrix *M, size_t RoC, size_t Entry)
/* returns the value of a matrix entry */
{
    Real Val;

    if (LASResult() == LASOK)
        if ((M->ElOrder == Rowws && RoC > 0 && RoC <= M->RowDim) ||
            ((M->ElOrder == Clmws && RoC > 0 && RoC <= M->ClmDim) &&
            (Entry < M->Len[RoC]))) {
            Val = M->El[RoC][Entry].Val;
        } else {
            LASError(LASRangeErr, "M_GetVal", M->Name, NULL, NULL);
	    Val = 0.0;
	}
    else
        Val = 0.0;
    return(Val);
}